

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_resource_manager.cpp
# Opt level: O0

TextureId __thiscall
CS248::GLResourceManager::createColorTextureFromFrameBuffer
          (GLResourceManager *this,FrameBufferId fbid,int texture_size)

{
  TextureId TVar1;
  undefined4 in_EDX;
  unique_ptr<CS248::Cleanup,_std::default_delete<CS248::Cleanup>_> *in_RDI;
  unique_ptr<CS248::Cleanup,_std::default_delete<CS248::Cleanup>_> fb_bind;
  unique_ptr<CS248::Cleanup,_std::default_delete<CS248::Cleanup>_> tex_bind;
  TextureId texid;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  GLResourceManager *in_stack_ffffffffffffffc0;
  FrameBufferId in_stack_ffffffffffffffcc;
  
  TVar1 = createTexture((GLResourceManager *)
                        CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  bindTexture(in_stack_ffffffffffffffc0,(TextureId)in_stack_ffffffffffffffcc.id);
  glTexImage2D(0xde1,0,0x1907,in_EDX,in_EDX,0,0x1908,0x1401,0);
  glTexParameteri(0xde1,0x2800,0x2600);
  glTexParameteri(0xde1,0x2801,0x2600);
  glTexParameteri(0xde1,0x2802,0x812f);
  glTexParameteri(0xde1,0x2803,0x812f);
  std::unique_ptr<CS248::Cleanup,_std::default_delete<CS248::Cleanup>_>::~unique_ptr(in_RDI);
  bindFrameBuffer(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffcc);
  (*__glewFramebufferTexture2D)(0x8d40,0x8ce0,0xde1,TVar1.id,0);
  std::unique_ptr<CS248::Cleanup,_std::default_delete<CS248::Cleanup>_>::~unique_ptr(in_RDI);
  return (TextureId)TVar1.id;
}

Assistant:

TextureId GLResourceManager::createColorTextureFromFrameBuffer(FrameBufferId fbid, int texture_size) {
  TextureId texid = createTexture();
  {
  	auto tex_bind = bindTexture(texid);
  	glTexImage2D(GL_TEXTURE_2D, /*level=*/0, GL_RGB, /*width=*/texture_size,
        /*height=*/texture_size, /*border=*/0, GL_RGBA, GL_UNSIGNED_BYTE, /*data=*/0);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
  }
  {
    auto fb_bind = bindFrameBuffer(fbid);
    glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, texid.id, /*level=*/0);
  }
  return texid; 
}